

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],String *params_1,
          char (*params_2) [3])

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  ArrayPtr<const_char> local_80;
  long lStack_70;
  undefined8 *local_68;
  long local_60;
  undefined8 uStack_58;
  undefined8 *local_50;
  String *local_48;
  char *local_40;
  kj *local_38;
  ArrayDisposer *local_30;
  
  local_30 = (ArrayDisposer *)strlen((char *)this);
  lStack_70 = *(long *)(params[1] + 3);
  local_80.ptr = (char *)0x0;
  if (lStack_70 != 0) {
    local_80.ptr = (char *)(lStack_70 + -1);
  }
  local_80.size_ = *(size_t *)params;
  local_68 = *(undefined8 **)(params[3] + 1);
  *(undefined8 *)params = 0;
  *(undefined8 *)(params[1] + 3) = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = (undefined8 *)0x0;
  local_38 = this;
  local_40 = (char *)strlen((char *)params_1);
  local_48 = params_1;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_80,(StringTree *)&local_48,
             (ArrayPtr<const_char> *)params_2);
  uVar3 = uStack_58;
  lVar2 = local_60;
  if (local_60 != 0) {
    local_60 = 0;
    uStack_58 = 0;
    (**(code **)*local_50)
              (local_50,lVar2,0x40,uVar3,uVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  lVar2 = lStack_70;
  sVar1 = local_80.size_;
  if (local_80.size_ != 0) {
    local_80.size_ = 0;
    lStack_70 = 0;
    (**(code **)*local_68)(local_68,sVar1,1,lVar2,lVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}